

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O2

void vkt::createInfoTests(TestCaseGroup *testGroup)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"build",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Build Info",&local_4a);
  addFunctionCase(testGroup,&local_28,&local_48,anon_unknown_0::logBuildInfo);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"device",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Device Info",&local_4a);
  addFunctionCase(testGroup,&local_28,&local_48,anon_unknown_0::logDeviceInfo);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"platform",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Platform Info",&local_4a);
  addFunctionCase(testGroup,&local_28,&local_48,anon_unknown_0::logPlatformInfo);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"memory_limits",&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Platform Memory Limits",&local_4a);
  addFunctionCase(testGroup,&local_28,&local_48,anon_unknown_0::logPlatformMemoryLimits);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void createInfoTests (tcu::TestCaseGroup* testGroup)
{
	addFunctionCase(testGroup, "build",			"Build Info",				logBuildInfo);
	addFunctionCase(testGroup, "device",		"Device Info",				logDeviceInfo);
	addFunctionCase(testGroup, "platform",		"Platform Info",			logPlatformInfo);
	addFunctionCase(testGroup, "memory_limits",	"Platform Memory Limits",	logPlatformMemoryLimits);
}